

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBColorMatrixRow_C(uint8_t *src_argb,uint8_t *dst_argb,int8_t *matrix_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  
  if (0 < width) {
    lVar19 = 0;
    do {
      bVar1 = src_argb[lVar19 * 4];
      bVar2 = src_argb[lVar19 * 4 + 1];
      bVar3 = src_argb[lVar19 * 4 + 3];
      uVar20 = (uint)bVar2;
      uVar16 = (uint)src_argb[lVar19 * 4 + 2];
      uVar18 = (uint)bVar3;
      iVar17 = (int)((int)matrix_argb[3] * uVar18 + (int)matrix_argb[2] * uVar16 +
                    (int)matrix_argb[1] * uVar20 + (int)*matrix_argb * (uint)bVar1) >> 6;
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      if (0xfe < iVar17) {
        iVar17 = 0xff;
      }
      cVar4 = matrix_argb[4];
      cVar5 = matrix_argb[5];
      cVar6 = matrix_argb[6];
      cVar7 = matrix_argb[7];
      cVar8 = matrix_argb[8];
      cVar9 = matrix_argb[9];
      cVar10 = matrix_argb[10];
      cVar11 = matrix_argb[0xb];
      cVar12 = matrix_argb[0xc];
      cVar13 = matrix_argb[0xd];
      cVar14 = matrix_argb[0xe];
      cVar15 = matrix_argb[0xf];
      dst_argb[lVar19 * 4] = (uint8_t)iVar17;
      iVar17 = (int)((int)cVar7 * (uint)bVar3 + (int)cVar6 * uVar16 +
                    (int)cVar5 * (uint)bVar2 + (int)cVar4 * (uint)bVar1) >> 6;
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      if (0xfe < iVar17) {
        iVar17 = 0xff;
      }
      iVar21 = (int)((int)cVar11 * uVar18 + (int)cVar10 * uVar16 +
                    (int)cVar9 * uVar20 + (int)cVar8 * (uint)bVar1) >> 6;
      dst_argb[lVar19 * 4 + 1] = (uint8_t)iVar17;
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      if (0xfe < iVar21) {
        iVar21 = 0xff;
      }
      iVar17 = (int)((int)cVar15 * uVar18 + (int)cVar14 * uVar16 +
                    (int)cVar13 * uVar20 + (int)cVar12 * (uint)bVar1) >> 6;
      dst_argb[lVar19 * 4 + 2] = (uint8_t)iVar21;
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      if (0xfe < iVar17) {
        iVar17 = 0xff;
      }
      dst_argb[lVar19 * 4 + 3] = (uint8_t)iVar17;
      lVar19 = lVar19 + 1;
    } while (width != (int)lVar19);
  }
  return;
}

Assistant:

void ARGBColorMatrixRow_C(const uint8_t* src_argb,
                          uint8_t* dst_argb,
                          const int8_t* matrix_argb,
                          int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = src_argb[0];
    int g = src_argb[1];
    int r = src_argb[2];
    int a = src_argb[3];
    int sb = (b * matrix_argb[0] + g * matrix_argb[1] + r * matrix_argb[2] +
              a * matrix_argb[3]) >>
             6;
    int sg = (b * matrix_argb[4] + g * matrix_argb[5] + r * matrix_argb[6] +
              a * matrix_argb[7]) >>
             6;
    int sr = (b * matrix_argb[8] + g * matrix_argb[9] + r * matrix_argb[10] +
              a * matrix_argb[11]) >>
             6;
    int sa = (b * matrix_argb[12] + g * matrix_argb[13] + r * matrix_argb[14] +
              a * matrix_argb[15]) >>
             6;
    dst_argb[0] = Clamp(sb);
    dst_argb[1] = Clamp(sg);
    dst_argb[2] = Clamp(sr);
    dst_argb[3] = Clamp(sa);
    src_argb += 4;
    dst_argb += 4;
  }
}